

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O2

bool __thiscall CNetAddr::IsLocal(CNetAddr *this)

{
  char cVar1;
  bool bVar2;
  long in_FS_OFFSET;
  undefined1 auVar3 [16];
  
  if (this->m_net == NET_IPV6) {
    if (0x10 < (this->m_addr)._size) {
      this = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
    }
    auVar3[0] = -((this->m_addr)._union.direct[0] == '\0');
    auVar3[1] = -((this->m_addr)._union.direct[1] == '\0');
    auVar3[2] = -((this->m_addr)._union.direct[2] == '\0');
    auVar3[3] = -((this->m_addr)._union.direct[3] == '\0');
    auVar3[4] = -((this->m_addr)._union.direct[4] == '\0');
    auVar3[5] = -((this->m_addr)._union.direct[5] == '\0');
    auVar3[6] = -((this->m_addr)._union.direct[6] == '\0');
    auVar3[7] = -((this->m_addr)._union.direct[7] == '\0');
    auVar3[8] = -((this->m_addr)._union.direct[8] == '\0');
    auVar3[9] = -((this->m_addr)._union.direct[9] == '\0');
    auVar3[10] = -((this->m_addr)._union.direct[10] == '\0');
    auVar3[0xb] = -((this->m_addr)._union.direct[0xb] == '\0');
    auVar3[0xc] = -((this->m_addr)._union.direct[0xc] == '\0');
    auVar3[0xd] = -((this->m_addr)._union.direct[0xd] == '\0');
    auVar3[0xe] = -((this->m_addr)._union.direct[0xe] == '\0');
    auVar3[0xf] = -((this->m_addr)._union.direct[0xf] == '\x01');
    if ((ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) | (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe | (ushort)(auVar3[0xf] >> 7) << 0xf)
        == 0xffff) {
      bVar2 = true;
      goto LAB_00a8358c;
    }
  }
  else if (this->m_net == NET_IPV4) {
    if (0x10 < (this->m_addr)._size) {
      this = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
    }
    cVar1 = (this->m_addr)._union.direct[0];
    bVar2 = cVar1 == '\0' || cVar1 == '\x7f';
    goto LAB_00a8358c;
  }
  bVar2 = false;
LAB_00a8358c:
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool CNetAddr::IsLocal() const
{
    // IPv4 loopback (127.0.0.0/8 or 0.0.0.0/8)
    if (IsIPv4() && (m_addr[0] == 127 || m_addr[0] == 0)) {
        return true;
    }

    // IPv6 loopback (::1/128)
    static const unsigned char pchLocal[16] = {0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,1};
    if (IsIPv6() && memcmp(m_addr.data(), pchLocal, sizeof(pchLocal)) == 0) {
        return true;
    }

    return false;
}